

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

int perm5(int z,int p_high,int p_low)

{
  uint uVar1;
  int local_f8 [2];
  int index2 [14];
  int local_b8 [2];
  int index1 [14];
  uint auStack_78 [2];
  int p [14];
  uint auStack_38 [2];
  int z_bit [5];
  int output;
  int tmp;
  int i;
  int p_low_local;
  int p_high_local;
  int z_local;
  
  memcpy(local_b8,&DAT_001109c0,0x38);
  memcpy(local_f8,&DAT_00110a00,0x38);
  for (output = 0; output < 9; output = output + 1) {
    auStack_78[output] = p_low >> ((byte)output & 0x1f) & 1;
  }
  for (output = 0; output < 5; output = output + 1) {
    auStack_78[output + 9] = p_high >> ((byte)output & 0x1f) & 1;
  }
  for (output = 0; output < 5; output = output + 1) {
    auStack_38[output] = z >> ((byte)output & 0x1f) & 1;
  }
  for (output = 0xd; -1 < output; output = output + -1) {
    if (auStack_78[output] != 0) {
      uVar1 = auStack_38[local_b8[output]];
      auStack_38[local_b8[output]] = auStack_38[local_f8[output]];
      auStack_38[local_f8[output]] = uVar1;
    }
  }
  z_bit[4] = 0;
  for (output = 0; output < 5; output = output + 1) {
    z_bit[4] = (auStack_38[output] << ((byte)output & 0x1f)) + z_bit[4];
  }
  return z_bit[4];
}

Assistant:

int perm5(int z, int p_high, int p_low)
{
	int i, tmp, output, z_bit[5], p[14];
	int index1[] = {0, 2, 1, 3, 0, 1, 0, 3, 1, 0, 2, 1, 0, 1};
	int index2[] = {1, 3, 2, 4, 4, 3, 2, 4, 4, 3, 4, 3, 3, 2};

	/* bits of p_low and p_high are control signals */
	for (i = 0; i < 9; i++)
		p[i] = (p_low >> i) & 0x01;
	for (i = 0; i < 5; i++)
		p[i+9] = (p_high >> i) & 0x01;

	/* bit swapping will be easier with an array of bits */
	for (i = 0; i < 5; i++)
		z_bit[i] = (z >> i) & 0x01;

	/* butterfly operations */
	for (i = 13; i >= 0; i--) {
		/* swap bits according to index arrays if control signal tells us to */
		if (p[i]) {
			tmp = z_bit[index1[i]];
			z_bit[index1[i]] = z_bit[index2[i]];
			z_bit[index2[i]] = tmp;
		}
	}

	/* reconstruct output from rearranged bits */
	output = 0;
	for (i = 0; i < 5; i++)
		output += z_bit[i] << i;

	return(output);
}